

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O2

string * duckdb::StandardStringCast<double>(string *__return_storage_ptr__,double input)

{
  LogicalType local_a0;
  anon_union_16_2_67f50693_for_value local_88;
  Vector v;
  
  LogicalType::LogicalType(&local_a0,VARCHAR);
  Vector::Vector(&v,&local_a0,0x800);
  LogicalType::~LogicalType(&local_a0);
  local_88.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringCast::Operation<double>(input,&v);
  string_t::GetString_abi_cxx11_(__return_storage_ptr__,(string_t *)&local_88.pointer);
  Vector::~Vector(&v);
  return __return_storage_ptr__;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}